

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

lua_Integer unpackint(lua_State *L,char *str,int islittle,int size,int issigned)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar9 = 8;
  if (size < 8) {
    uVar9 = size;
  }
  if (size < 1) {
    uVar10 = 0;
  }
  else {
    iVar1 = uVar9 + 1;
    iVar4 = size - uVar9;
    uVar10 = 0;
    do {
      uVar5 = uVar10 << 8;
      iVar7 = iVar1 + -2;
      if (islittle == 0) {
        iVar7 = iVar4;
      }
      uVar10 = (byte)str[iVar7] | uVar5;
      iVar1 = iVar1 + -1;
      iVar4 = iVar4 + 1;
    } while (1 < iVar1);
    if (7 < size) {
      if (size == 8) {
        return uVar10;
      }
      cVar3 = -1;
      if (-1 < (long)uVar5) {
        cVar3 = '\0';
      }
      if (issigned == 0) {
        cVar3 = '\0';
      }
      uVar8 = ~uVar9 + size;
      do {
        uVar2 = uVar9;
        if (islittle == 0) {
          uVar2 = uVar8;
        }
        if (cVar3 != str[(int)uVar2]) {
          luaL_error(L,"%d-byte integer does not fit into Lua Integer",(ulong)(uint)size);
        }
        uVar9 = uVar9 + 1;
        uVar8 = uVar8 - 1;
      } while ((int)uVar9 < size);
      return uVar10;
    }
  }
  if (issigned != 0) {
    bVar6 = (char)(size << 3) - 1;
    uVar10 = (uVar10 ^ 1L << ((ulong)bVar6 & 0x3f)) - (1L << (bVar6 & 0x3f));
  }
  return uVar10;
}

Assistant:

static lua_Integer unpackint (lua_State *L, const char *str,
                              int islittle, int size, int issigned) {
  lua_Unsigned res = 0;
  int i;
  int limit = (size  <= SZINT) ? size : SZINT;
  for (i = limit - 1; i >= 0; i--) {
    res <<= NB;
    res |= (lua_Unsigned)(unsigned char)str[islittle ? i : size - 1 - i];
  }
  if (size < SZINT) {  /* real size smaller than lua_Integer? */
    if (issigned) {  /* needs sign extension? */
      lua_Unsigned mask = (lua_Unsigned)1 << (size*NB - 1);
      res = ((res ^ mask) - mask);  /* do sign extension */
    }
  }
  else if (size > SZINT) {  /* must check unread bytes */
    int mask = (!issigned || (lua_Integer)res >= 0) ? 0 : MC;
    for (i = limit; i < size; i++) {
      if ((unsigned char)str[islittle ? i : size - 1 - i] != mask)
        luaL_error(L, "%d-byte integer does not fit into Lua Integer", size);
    }
  }
  return (lua_Integer)res;
}